

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.h
# Opt level: O2

void __thiscall
testing::TestPartResult::TestPartResult
          (TestPartResult *this,Type a_type,char *a_file_name,int a_line_number,char *a_message)

{
  this->type_ = a_type;
  internal::String::String(&this->file_name_,a_file_name);
  this->line_number_ = a_line_number;
  ExtractSummary((TestPartResult *)&this->summary_,a_message);
  internal::String::String(&this->message_,a_message);
  return;
}

Assistant:

TestPartResult(Type a_type,
                 const char* a_file_name,
                 int a_line_number,
                 const char* a_message)
      : type_(a_type),
        file_name_(a_file_name),
        line_number_(a_line_number),
        summary_(ExtractSummary(a_message)),
        message_(a_message) {
  }